

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall
CGL::GLScene::Scene::set_draw_styles
          (Scene *this,DrawStyle *defaultStyle,DrawStyle *hoveredStyle,DrawStyle *selectedStyle)

{
  pointer ppSVar1;
  pointer ppSVar2;
  
  ppSVar1 = (this->objects).
            super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar2 = (this->objects).
                 super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar2 != ppSVar1;
      ppSVar2 = ppSVar2 + 1) {
    (**(*ppSVar2)->_vptr_SceneObject)(*ppSVar2,defaultStyle,hoveredStyle,selectedStyle);
  }
  return;
}

Assistant:

void Scene::set_draw_styles(DrawStyle *defaultStyle, DrawStyle *hoveredStyle,
                             DrawStyle *selectedStyle) {
  for (SceneObject *obj : objects) {
    obj->set_draw_styles(defaultStyle, hoveredStyle, selectedStyle);
  }
}